

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationGeometryPassthroughTests.cpp
# Opt level: O2

TestCaseGroup * vkt::tessellation::createGeometryPassthroughTests(TestContext *testCtx)

{
  TestCaseGroup *pTVar1;
  TestNode *pTVar2;
  TestNode *node;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> group;
  
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,testCtx,"passthrough",
             "Render various types with either passthrough geometry or tessellation shader");
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       (TestCaseGroup *)pTVar2;
  node = (TestNode *)
         anon_unknown_2::makeIdentityGeometryShaderCase(testCtx,TESSPRIMITIVETYPE_TRIANGLES);
  tcu::TestNode::addChild(pTVar2,node);
  pTVar1 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
           m_data.ptr;
  pTVar2 = (TestNode *)
           anon_unknown_2::makeIdentityGeometryShaderCase(testCtx,TESSPRIMITIVETYPE_QUADS);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,pTVar2);
  pTVar1 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
           m_data.ptr;
  pTVar2 = (TestNode *)
           anon_unknown_2::makeIdentityGeometryShaderCase(testCtx,TESSPRIMITIVETYPE_ISOLINES);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,pTVar2);
  pTVar1 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
           m_data.ptr;
  pTVar2 = (TestNode *)
           anon_unknown_2::makeIdentityTessellationShaderCase(testCtx,TESSPRIMITIVETYPE_TRIANGLES);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,pTVar2);
  pTVar1 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
           m_data.ptr;
  pTVar2 = (TestNode *)
           anon_unknown_2::makeIdentityTessellationShaderCase(testCtx,TESSPRIMITIVETYPE_ISOLINES);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,pTVar2);
  pTVar1 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
           m_data.ptr;
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       (TestCaseGroup *)0x0;
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  return pTVar1;
}

Assistant:

tcu::TestCaseGroup* createGeometryPassthroughTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> group (new tcu::TestCaseGroup(testCtx, "passthrough", "Render various types with either passthrough geometry or tessellation shader"));

	// Passthrough geometry shader
	group->addChild(makeIdentityGeometryShaderCase(testCtx, TESSPRIMITIVETYPE_TRIANGLES));
	group->addChild(makeIdentityGeometryShaderCase(testCtx, TESSPRIMITIVETYPE_QUADS));
	group->addChild(makeIdentityGeometryShaderCase(testCtx, TESSPRIMITIVETYPE_ISOLINES));

	// Passthrough tessellation shader
	group->addChild(makeIdentityTessellationShaderCase(testCtx, TESSPRIMITIVETYPE_TRIANGLES));
	group->addChild(makeIdentityTessellationShaderCase(testCtx, TESSPRIMITIVETYPE_ISOLINES));

	return group.release();
}